

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O3

void re2::ConvertRunesToBytes(bool latin1,Rune *runes,int nrunes,string *bytes)

{
  int iVar1;
  pointer pcVar2;
  ulong uVar3;
  pointer str;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,latin1) == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
               (long)(nrunes * 4),'\0');
    pcVar2 = (bytes->_M_dataplus)._M_p;
    str = pcVar2;
    if (0 < nrunes) {
      uVar3 = (ulong)(uint)nrunes;
      do {
        iVar1 = runetochar(str,runes);
        str = str + iVar1;
        runes = runes + 1;
        uVar3 = uVar3 - 1;
      } while (uVar3 != 0);
      pcVar2 = (bytes->_M_dataplus)._M_p;
    }
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
               (long)str - (long)pcVar2,'\0');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve(bytes);
  }
  else {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::resize
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)bytes,
               (long)nrunes,'\0');
    if (0 < nrunes) {
      uVar3 = 0;
      do {
        (bytes->_M_dataplus)._M_p[uVar3] = (char)runes[uVar3];
        uVar3 = uVar3 + 1;
      } while ((uint)nrunes != uVar3);
    }
  }
  return;
}

Assistant:

void ConvertRunesToBytes(bool latin1, Rune* runes, int nrunes,
                         std::string* bytes) {
  if (latin1) {
    bytes->resize(nrunes);
    for (int i = 0; i < nrunes; i++)
      (*bytes)[i] = static_cast<char>(runes[i]);
  } else {
    bytes->resize(nrunes * UTFmax);  // worst case
    char* p = &(*bytes)[0];
    for (int i = 0; i < nrunes; i++)
      p += runetochar(p, &runes[i]);
    bytes->resize(p - &(*bytes)[0]);
    bytes->shrink_to_fit();
  }
}